

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d.c
# Opt level: O2

void av1_get_fwd_txfm_cfg(TX_TYPE tx_type,TX_SIZE tx_size,TXFM_2D_FLIP_CFG *cfg)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  int8_t *piVar4;
  int8_t *piVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int i;
  long lVar10;
  ulong uVar11;
  
  cfg->tx_size = tx_size;
  iVar6 = 0;
  iVar7 = 0;
  if ((byte)(tx_type - 4) < 0xc) {
    lVar8 = (ulong)(byte)(tx_type - 4) * 4;
    iVar6 = *(int *)(&DAT_004b96a4 + lVar8);
    iVar7 = *(int *)(&DAT_004b96d4 + lVar8);
  }
  cfg->ud_flip = iVar6;
  cfg->lr_flip = iVar7;
  bVar1 = ""[tx_type];
  bVar2 = ""[tx_type];
  lVar10 = (long)*(int *)((long)tx_size_wide_log2 + (ulong)((uint)tx_size * 4));
  lVar9 = (long)*(int *)((long)tx_size_high_log2 + (ulong)((uint)tx_size * 4));
  cfg->shift = av1_fwd_txfm_shift_ls[tx_size];
  lVar8 = lVar10 * 5;
  cfg->cos_bit_col = ""[lVar9 + lVar8 + 1];
  cfg->cos_bit_row = *(int8_t *)(lVar9 + lVar8 + 0x4b94f4);
  bVar1 = *(byte *)((ulong)bVar1 + lVar9 * 4 + 0x46cc28);
  cfg->txfm_type_col = bVar1;
  bVar2 = *(byte *)((ulong)bVar2 + lVar10 * 4 + 0x46cc28);
  cfg->txfm_type_row = bVar2;
  cVar3 = "\x04\x06\b\n\f\a\b\n\x01\x01\x01\x01"[bVar1];
  cfg->stage_num_col = (int)cVar3;
  cfg->stage_num_row = (int)"\x04\x06\b\n\f\a\b\n\x01\x01\x01\x01"[bVar2];
  cfg->stage_range_row[4] = '\0';
  cfg->stage_range_row[5] = '\0';
  cfg->stage_range_row[6] = '\0';
  cfg->stage_range_row[7] = '\0';
  cfg->stage_range_row[8] = '\0';
  cfg->stage_range_row[9] = '\0';
  cfg->stage_range_row[10] = '\0';
  cfg->stage_range_row[0xb] = '\0';
  cfg->stage_range_col[0] = '\0';
  cfg->stage_range_col[1] = '\0';
  cfg->stage_range_col[2] = '\0';
  cfg->stage_range_col[3] = '\0';
  cfg->stage_range_col[4] = '\0';
  cfg->stage_range_col[5] = '\0';
  cfg->stage_range_col[6] = '\0';
  cfg->stage_range_col[7] = '\0';
  *(undefined8 *)(cfg->stage_range_col + 8) = 0;
  piVar4 = fwd_txfm_range_mult2_list[bVar1];
  for (uVar11 = 0; ((long)uVar11 < (long)cVar3 && (uVar11 < 0xc)); uVar11 = uVar11 + 1) {
    cfg->stage_range_col[uVar11] = (int8_t)((int)piVar4[uVar11] + 1U >> 1);
  }
  piVar5 = fwd_txfm_range_mult2_list[cfg->txfm_type_row];
  iVar6 = cfg->stage_num_row;
  for (uVar11 = 0; ((long)uVar11 < (long)iVar6 && (uVar11 < 0xc)); uVar11 = uVar11 + 1) {
    cfg->stage_range_row[uVar11] =
         (int8_t)((int)piVar4[(long)cVar3 + -1] + (int)piVar5[uVar11] + 1U >> 1);
  }
  return;
}

Assistant:

void av1_get_fwd_txfm_cfg(TX_TYPE tx_type, TX_SIZE tx_size,
                          TXFM_2D_FLIP_CFG *cfg) {
  assert(cfg != NULL);
  cfg->tx_size = tx_size;
  set_flip_cfg(tx_type, cfg);
  const TX_TYPE_1D tx_type_1d_col = vtx_tab[tx_type];
  const TX_TYPE_1D tx_type_1d_row = htx_tab[tx_type];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  cfg->shift = av1_fwd_txfm_shift_ls[tx_size];
  cfg->cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  cfg->cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  cfg->txfm_type_col = av1_txfm_type_ls[txh_idx][tx_type_1d_col];
  assert(cfg->txfm_type_col != TXFM_TYPE_INVALID);
  cfg->txfm_type_row = av1_txfm_type_ls[txw_idx][tx_type_1d_row];
  assert(cfg->txfm_type_row != TXFM_TYPE_INVALID);
  cfg->stage_num_col = av1_txfm_stage_num_list[cfg->txfm_type_col];
  cfg->stage_num_row = av1_txfm_stage_num_list[cfg->txfm_type_row];
  set_fwd_txfm_non_scale_range(cfg);
}